

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<long_long> * __thiscall
TPZVec<long_long>::operator=(TPZVec<long_long> *this,TPZVec<long_long> *copy)

{
  long lVar1;
  longlong *plVar2;
  longlong *plVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    lVar1 = copy->fNElements;
    if (0 < lVar1) {
      plVar2 = copy->fStore;
      plVar3 = this->fStore;
      lVar4 = 0;
      do {
        plVar3[lVar4] = plVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}